

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AttributeRecordSet *this)

{
  pointer pKVar1;
  KString *pKVar2;
  ostream *poVar3;
  KCHAR8 in_CL;
  pointer pKVar4;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"AttributeRecordSet:",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n\tEntity ID:\n",0xd);
  EntityIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_EntityID);
  UTILS::IndentString(&local_200,&local_1e0,2,in_CL);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\n\tNumber Of Attribute Records: ",0x1f);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\tRecords:\n",0xb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_1c0 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pKVar4 = (this->m_vAttrRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar1 = (this->m_vAttrRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar4 != pKVar1) {
    do {
      (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_1e0);
      UTILS::IndentString(&local_200,&local_1e0,1,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      pKVar4 = pKVar4 + 1;
    } while (pKVar4 != pKVar1);
  }
  pKVar2 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString AttributeRecordSet::GetAsString() const
{
    KStringStream ss;

    ss << "AttributeRecordSet:"
       << "\n\tEntity ID:\n" << IndentString( m_EntityID.GetAsString(), 2 )
       << "\n\tNumber Of Attribute Records: " << m_ui16NumAttrRecs 
       << "\n\tRecords:\n";

    vector<StdVarPtr>::const_iterator citr = m_vAttrRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vAttrRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( ( *citr )->GetAsString(), 1 );
    }

    return ss.str();
}